

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

TSNode * ts_node__child(TSNode *__return_storage_ptr__,TSNode self,uint32_t child_index,
                       _Bool include_anonymous)

{
  ulong uVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  TSNode result;
  NodeChildIterator iterator;
  TSNode local_88;
  NodeChildIterator local_60;
  
  local_88.id = self.id;
  local_88.tree = self.tree;
  local_88.context[0] = self.context[0];
  local_88.context[1] = self.context[1];
  local_88.context[2] = self.context[2];
  local_88.context[3] = self.context[3];
  _Var2 = true;
  do {
    if (_Var2 == false) {
      __return_storage_ptr__->id = (void *)0x0;
      __return_storage_ptr__->tree = (TSTree *)0x0;
      __return_storage_ptr__->context[0] = 0;
      __return_storage_ptr__->context[1] = 0;
      __return_storage_ptr__->context[2] = 0;
      __return_storage_ptr__->context[3] = 0;
      return __return_storage_ptr__;
    }
    ts_node_iterate_children(&local_88);
    uVar5 = 0;
    while (_Var2 = ts_node_child_iterator_next(&local_60,__return_storage_ptr__), _Var2) {
      _Var3 = ts_node__is_relevant(*__return_storage_ptr__,include_anonymous);
      if (_Var3) {
        if (child_index == uVar5) {
          ts_tree_set_cached_parent(self.tree,__return_storage_ptr__,&self);
          return __return_storage_ptr__;
        }
        uVar5 = uVar5 + 1;
      }
      else {
        uVar1 = *__return_storage_ptr__->id;
        uVar4 = 0;
        if (((uVar1 & 1) == 0) && (uVar4 = 0, *(int *)(uVar1 + 0x24) != 0)) {
          uVar4 = *(uint *)(uVar1 + (ulong)!include_anonymous * 4 + 0x38);
          if (child_index - uVar5 < uVar4) {
            local_88.context._0_8_ = *(undefined8 *)__return_storage_ptr__->context;
            local_88.context._8_8_ = *(undefined8 *)(__return_storage_ptr__->context + 2);
            local_88.id = __return_storage_ptr__->id;
            local_88.tree = __return_storage_ptr__->tree;
            child_index = child_index - uVar5;
            break;
          }
        }
        uVar5 = uVar5 + uVar4;
      }
    }
  } while( true );
}

Assistant:

static inline TSNode ts_node__child(TSNode self, uint32_t child_index, bool include_anonymous) {
  TSNode result = self;
  bool did_descend = true;

  while (did_descend) {
    did_descend = false;

    TSNode child;
    uint32_t index = 0;
    NodeChildIterator iterator = ts_node_iterate_children(&result);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (ts_node__is_relevant(child, include_anonymous)) {
        if (index == child_index) {
          ts_tree_set_cached_parent(self.tree, &child, &self);
          return child;
        }
        index++;
      } else {
        uint32_t grandchild_index = child_index - index;
        uint32_t grandchild_count = ts_node__relevant_child_count(child, include_anonymous);
        if (grandchild_index < grandchild_count) {
          did_descend = true;
          result = child;
          child_index = grandchild_index;
          break;
        }
        index += grandchild_count;
      }
    }
  }

  return ts_node__null();
}